

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O3

void __thiscall brynet::net::AcceptError::AcceptError(AcceptError *this,int errorCode)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint __val;
  uint __len;
  string __str;
  long *local_50 [2];
  long local_40 [2];
  
  __val = -errorCode;
  if (0 < errorCode) {
    __val = errorCode;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_0012c7b6;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_0012c7b6;
      }
      if (uVar2 < 10000) goto LAB_0012c7b6;
      uVar3 = uVar3 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_0012c7b6:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(errorCode >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)errorCode >> 0x1f) + (long)local_50[0]),__len,__val);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_001484a0;
  this->mErrorCode = errorCode;
  return;
}

Assistant:

AcceptError(int errorCode) 
                : 
                std::runtime_error(std::to_string(errorCode)), 
                mErrorCode(errorCode)
            {}